

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_array_clear(JSON_Array *array)

{
  ulong uVar1;
  
  if (array != (JSON_Array *)0x0) {
    for (uVar1 = 0; uVar1 < array->count; uVar1 = uVar1 + 1) {
      json_value_free(array->items[uVar1]);
    }
    array->count = 0;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_clear(JSON_Array *array) {
    size_t i = 0;
    if (array == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_array_get_count(array); i++) {
        json_value_free(json_array_get_value(array, i));
    }
    array->count = 0;
    return JSONSuccess;
}